

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerAdapterPipe.cxx
# Opt level: O1

bool testProtocolWithPipes(void)

{
  pointer pCVar1;
  future_status fVar2;
  int iVar3;
  TypeInfo *pTVar4;
  ostream *poVar5;
  unique_lock *puVar6;
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__state;
  CMakeInitializeRequest *pCVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  CMakeInitializeRequest *pCVar9;
  bool bVar10;
  unique_ptr<dap::Session,_std::default_delete<dap::Session>_> client;
  seconds futureTimeout;
  ConfigurationDoneRequest configurationDoneRequest;
  shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> client2Debugger;
  ScopedThread debuggerThread;
  future<dap::ResponseOrError<dap::CMakeInitializeResponse>_> response;
  future<void> startedListeningFuture;
  string namedPipe;
  ResponseOrError<dap::DisconnectResponse> disconnectResponse;
  ResponseOrError<dap::ConfigurationDoneResponse> configurationDoneResponse;
  future<bool> disconnectResponseReceivedFuture;
  future<bool> threadExitedFuture;
  future<bool> threadStartedFuture;
  future<bool> terminatedEventReceivedFuture;
  future<bool> exitedEventReceivedFuture;
  future<bool> initializedEventReceivedFuture;
  future<bool> debuggerAdapterInitializedFuture;
  future<void> debuggerConnectionCreatedFuture;
  promise<bool> disconnectResponseReceivedPromise;
  promise<bool> threadStartedPromise;
  promise<bool> debuggerAdapterInitializedPromise;
  LaunchRequest launchRequest;
  promise<bool> threadExitedPromise;
  promise<bool> terminatedEventReceivedPromise;
  promise<bool> exitedEventReceivedPromise;
  promise<bool> initializedEventReceivedPromise;
  promise<void> debuggerConnectionCreatedPromise;
  DisconnectRequest disconnectRequest;
  ResponseOrError<dap::LaunchResponse> launchResponse;
  CMakeInitializeRequest initializeRequest;
  ResponseOrError<dap::CMakeInitializeResponse> initializeResponse;
  CMakeInitializeRequest *local_598;
  duration<long,_std::ratio<1L,_1L>_> local_590 [2];
  cmDebuggerPipeClient_POSIX *local_580;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_578;
  ScopedThread local_570;
  Session local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_560;
  _State_baseV2 *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_550;
  future<dap::ResponseOrError<dap::DisconnectResponse>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  ResponseOrError<dap::DisconnectResponse> local_510;
  ResponseOrError<dap::ConfigurationDoneResponse> local_4e8;
  __basic_future<bool> local_4c0;
  __basic_future<bool> local_4b0;
  __basic_future<bool> local_4a0;
  __basic_future<bool> local_490;
  __basic_future<bool> local_480;
  __basic_future<bool> local_470;
  __basic_future<bool> local_460;
  __basic_future<void> local_450;
  promise<bool> local_440;
  promise<bool> local_428;
  promise<bool> local_410;
  undefined1 local_3f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  promise<bool> local_398;
  promise<bool> local_380;
  promise<bool> local_368;
  promise<void> local_350;
  undefined4 local_338;
  undefined2 local_334;
  ResponseOrError<dap::LaunchResponse> local_330;
  cmDebuggerPipeClient_POSIX *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  undefined1 local_2f8 [33];
  undefined7 uStack_2d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined8 local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  undefined8 local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_270;
  CMakeInitializeRequest *local_268;
  undefined8 local_260;
  undefined1 local_258 [48];
  undefined1 local_228 [24];
  _Alloc_hider _Stack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  bool local_189;
  integer local_88;
  integer local_80;
  integer local_78;
  char local_70 [32];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  std::promise<void>::promise(&local_350);
  std::__basic_future<void>::__basic_future(&local_450,&local_350._M_future);
  local_558 = (_State_baseV2 *)0x0;
  p_Stack_550 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::promise<bool>::promise(&local_410);
  std::__basic_future<bool>::__basic_future(&local_460,&local_410._M_future);
  std::promise<bool>::promise(&local_368);
  std::__basic_future<bool>::__basic_future(&local_470,&local_368._M_future);
  std::promise<bool>::promise(&local_380);
  std::__basic_future<bool>::__basic_future(&local_480,&local_380._M_future);
  std::promise<bool>::promise(&local_398);
  std::__basic_future<bool>::__basic_future(&local_490,&local_398._M_future);
  std::promise<bool>::promise(&local_428);
  std::__basic_future<bool>::__basic_future(&local_4a0,&local_428._M_future);
  std::promise<bool>::promise((promise<bool> *)&local_3b0);
  __state = &local_3b0;
  std::__basic_future<bool>::__basic_future(&local_4b0,(__state_type *)__state);
  std::promise<bool>::promise(&local_440);
  std::__basic_future<bool>::__basic_future(&local_4c0,&local_440._M_future);
  local_590[0].__r = 0x3c;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  pbVar8 = &local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar8,"CMakeDebuggerPipe2","");
  dap::Session::create();
  pTVar4 = dap::TypeOf<dap::InitializedEvent>::type();
  local_228._8_8_ = 0;
  _Stack_210._M_p =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_manager;
  local_228._0_8_ = &local_368;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if ((pointer)local_228._16_8_ != (pointer)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  pTVar4 = dap::TypeOf<dap::ExitedEvent>::type();
  local_228._8_8_ = 0;
  _Stack_210._M_p =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_manager;
  local_228._0_8_ = &local_380;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if ((pointer)local_228._16_8_ != (pointer)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  pTVar4 = dap::TypeOf<dap::TerminatedEvent>::type();
  local_228._8_8_ = 0;
  _Stack_210._M_p =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_manager;
  local_228._0_8_ = &local_398;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if ((pointer)local_228._16_8_ != (pointer)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  pTVar4 = dap::TypeOf<dap::ThreadEvent>::type();
  local_228._0_8_ = &local_428;
  _Stack_210._M_p =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_manager;
  local_228._8_8_ = __state;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if ((pointer)local_228._16_8_ != (pointer)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  local_570.Thread._M_id._M_thread = (thread)(id)0x0;
  local_228._0_8_ = operator_new(0x38);
  *(undefined ***)local_228._0_8_ = &PTR___State_00bd8498;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_228._0_8_ + 8) =
       pbVar8;
  *(_State_baseV2 ***)(local_228._0_8_ + 0x10) = &local_558;
  *(promise<void> **)(local_228._0_8_ + 0x18) = &local_350;
  *(promise<bool> **)(local_228._0_8_ + 0x20) = &local_410;
  *(__basic_future<bool> **)(local_228._0_8_ + 0x28) = &local_4c0;
  *(duration<long,_std::ratio<1L,_1L>_> **)(local_228._0_8_ + 0x30) = local_590;
  std::thread::_M_start_thread(&local_570,local_228,0);
  if ((long *)local_228._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_228._0_8_ + 8))();
  }
  if (local_450._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (_State_baseV2 *)0x0) {
LAB_001fc27a:
    std::__throw_future_error(3);
    pCVar7 = local_598;
    pCVar9 = local_598;
LAB_001fc284:
    fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>(&local_480,local_590);
    if (fVar2 == ready) {
      local_334 = 0;
      local_338 = 0;
      dap::Session::send<dap::DisconnectRequest,void>
                ((Session *)&local_540,(DisconnectRequest *)local_598);
      dap::future<dap::ResponseOrError<dap::DisconnectResponse>_>::get(&local_510,&local_540);
      if (local_540.state.
          super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_540.state.
                   super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_540.state.
      super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_1_ = 1;
      std::promise<bool>::set_value(&local_440,(bool *)&local_540);
      bVar10 = local_510.error.message._M_string_length == 0;
      if (!bVar10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!disconnectResponse.error) failed on line ",
                   0x36);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0xb0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510.error.message._M_dataplus._M_p != &local_510.error.message.field_2) {
        operator_delete(local_510.error.message._M_dataplus._M_p,
                        local_510.error.message.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar3 = 0xab;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                 ,0x6b);
LAB_001fc2bb:
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar10 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8.error.message._M_dataplus._M_p != &local_4e8.error.message.field_2) {
      operator_delete(local_4e8.error.message._M_dataplus._M_p,
                      local_4e8.error.message.field_2._M_allocated_capacity + 1);
    }
LAB_001fc300:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.error.message._M_dataplus._M_p != &local_330.error.message.field_2) {
      operator_delete(local_330.error.message._M_dataplus._M_p,
                      local_330.error.message.field_2._M_allocated_capacity + 1);
    }
    dap::LaunchRequest::~LaunchRequest((LaunchRequest *)local_3f8);
  }
  else {
    fVar2 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1l>>
                      (local_450._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_590);
    if (fVar2 != ready) {
      iVar3 = 0x7f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                 ,0x71);
LAB_001fba32:
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar10 = false;
      goto LAB_001fba56;
    }
    if (local_558 == (_State_baseV2 *)0x0) goto LAB_001fc27a;
    fVar2 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1l>>(local_558,local_590)
    ;
    if (fVar2 != ready) {
      iVar3 = 0x81;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                 ,0x68);
      goto LAB_001fba32;
    }
    local_580 = (cmDebuggerPipeClient_POSIX *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmDebugger::cmDebuggerPipeClient_POSIX,std::allocator<cmDebugger::cmDebuggerPipeClient_POSIX>,std::__cxx11::string&>
              (&local_578,&local_580,(allocator<cmDebugger::cmDebuggerPipeClient_POSIX> *)local_228,
               &local_530);
    std::__shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<cmDebugger::cmDebuggerPipeClient_POSIX,cmDebugger::cmDebuggerPipeClient_POSIX>
              ((__shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,(__gnu_cxx::_Lock_policy)2> *)
               &local_580,local_580);
    cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection(local_580);
    local_308 = local_580;
    local_300 = local_578._M_pi;
    if (local_578._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_578._M_pi)->_M_use_count = (local_578._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_578._M_pi)->_M_use_count = (local_578._M_pi)->_M_use_count + 1;
      }
    }
    local_3f8 = (undefined1  [8])&(local_580->super_ReaderWriter).super_Writer;
    if (local_580 == (cmDebuggerPipeClient_POSIX *)0x0) {
      local_3f8 = (undefined1  [8])0x0;
    }
    local_3f0 = local_578._M_pi;
    if (local_578._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_578._M_pi)->_M_use_count = (local_578._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_578._M_pi)->_M_use_count = (local_578._M_pi)->_M_use_count + 1;
      }
    }
    local_228._16_8_ = (pointer)0x0;
    _Stack_210._M_p = (pointer)0x0;
    local_228._0_8_ = (long *)0x0;
    local_228._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x20))(local_598,&local_308,local_3f8);
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x28))(local_598,local_228);
    if ((pointer)local_228._16_8_ != (pointer)0x0) {
      (*(code *)local_228._16_8_)(local_228,local_228,3);
    }
    if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
    }
    if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
    }
    local_308 = (cmDebuggerPipeClient_POSIX *)local_2f8;
    local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8[0] = 0;
    pCVar7 = (CMakeInitializeRequest *)(local_2f8 + 0x20);
    local_2f8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8[0x20] = 0;
    local_2c8._M_local_buf[0] = '\0';
    pbVar8 = &local_2b0;
    local_2b8._0_4_ = 0;
    local_2b8._4_4_ = 0;
    local_2b0._M_dataplus._M_p._0_1_ = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    __state = &local_280;
    local_2b0.field_2._8_4_ = 0;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_270 = 0;
    pCVar9 = (CMakeInitializeRequest *)local_258;
    local_260 = 0;
    local_258[0] = 0;
    local_258[0x10] = '\0';
    local_258._24_8_ = 0;
    local_258._32_8_ = (pointer)0x0;
    local_258._40_2_ = 0;
    local_2f8._16_8_ = pCVar7;
    local_2c8._8_8_ = pbVar8;
    local_290 = __state;
    local_268 = pCVar9;
    dap::Session::send<dap::CMakeInitializeRequest,void>(&local_568,local_598);
    local_3f8 = (undefined1  [8])(local_568._vptr_Session + 0x3f);
    local_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_3f0 & 0xffffffffffffff00);
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_3f8);
    local_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_3f0._1_7_,true);
    if (*(char *)(local_568._vptr_Session + 0x4a) == '\0') {
      puVar6 = (unique_lock *)(local_568._vptr_Session + 0x44);
      do {
        std::condition_variable::wait(puVar6);
      } while (*(char *)(local_568._vptr_Session + 0x4a) != '\x01');
    }
    dap::CMakeInitializeResponse::CMakeInitializeResponse
              ((CMakeInitializeResponse *)local_228,
               (CMakeInitializeResponse *)local_568._vptr_Session);
    local_50._M_p = local_40;
    pCVar1 = (((CMakeInitializeResponse *)(local_568._vptr_Session + 0x3b))->additionalModuleColumns
             ).val.super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pCVar1,
               (long)&(((pointer)local_568._vptr_Session[0x3c])->attributeName)._M_dataplus._M_p +
               (long)pCVar1);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_3f8);
    if (local_48 == 0) {
      iVar3 = std::__cxx11::string::compare(local_70);
      if (iVar3 == 0) {
        if (local_88.val == 3) {
          if (local_80.val == 0x1d) {
            if (local_78.val == 0x134d7ca) {
              if (local_189 == false) {
                iVar3 = 0x94;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest) failed on line "
                           ,0x55);
              }
              else {
                if (local_1d0[0]._M_local_buf[0] != '\0') {
                  dap::LaunchRequest::LaunchRequest((LaunchRequest *)local_3f8);
                  dap::Session::send<dap::LaunchRequest,void>
                            ((Session *)&local_4e8,(LaunchRequest *)local_598);
                  dap::future<dap::ResponseOrError<dap::LaunchResponse>_>::get
                            (&local_330,
                             (future<dap::ResponseOrError<dap::LaunchResponse>_> *)&local_4e8);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_4e8.error.message._M_dataplus._M_p !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_4e8.error.message._M_dataplus._M_p);
                  }
                  if (local_330.error.message._M_string_length == 0) {
                    dap::Session::send<dap::ConfigurationDoneRequest,void>
                              ((Session *)&local_510,(ConfigurationDoneRequest *)local_598);
                    dap::future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_>::get
                              (&local_4e8,
                               (future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_> *)
                               &local_510);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_510.error.message._M_dataplus._M_p !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_510.error.message._M_dataplus._M_p);
                    }
                    if (local_4e8.error.message._M_string_length == 0) {
                      fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                        (&local_460,local_590);
                      if (fVar2 == ready) {
                        fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                          (&local_470,local_590);
                        if (fVar2 == ready) {
                          fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                            (&local_490,local_590);
                          if (fVar2 == ready) {
                            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                              (&local_4a0,local_590);
                            if (fVar2 == ready) {
                              fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                                (&local_4b0,local_590);
                              if (fVar2 == ready) goto LAB_001fc284;
                              iVar3 = 0xa9;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                         ,100);
                            }
                            else {
                              iVar3 = 0xa7;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                         ,0x65);
                            }
                          }
                          else {
                            iVar3 = 0xa5;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                       ,0x6f);
                          }
                        }
                        else {
                          iVar3 = 0xa3;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                     ,0x70);
                        }
                      }
                      else {
                        iVar3 = 0xa1;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                   ,0x72);
                      }
                    }
                    else {
                      iVar3 = 0x9e;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(!configurationDoneResponse.error) failed on line ",
                                 0x3d);
                    }
                    goto LAB_001fc2bb;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!launchResponse.error) failed on line ",0x32);
                  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x99);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                  bVar10 = false;
                  goto LAB_001fc300;
                }
                iVar3 = 0x96;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(initializeResponse.response.exceptionBreakpointFilters.has_value()) failed on line "
                           ,0x5f);
              }
            }
            else {
              iVar3 = 0x93;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch == CMake_VERSION_PATCH) failed on line "
                         ,0x62);
            }
          }
          else {
            iVar3 = 0x91;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor == CMake_VERSION_MINOR) failed on line "
                       ,0x62);
          }
        }
        else {
          iVar3 = 0x8f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(initializeResponse.response.cmakeVersion.major == CMake_VERSION_MAJOR) failed on line "
                     ,0x62);
        }
      }
      else {
        iVar3 = 0x8d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION) failed on line "
                   ,0x5b);
      }
    }
    else {
      iVar3 = 0x8c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!initializeResponse.error) failed on line ",0x36
                );
    }
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    bVar10 = false;
  }
  dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError
            ((ResponseOrError<dap::CMakeInitializeResponse> *)local_228);
  if (local_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560);
  }
  if (local_268 != pCVar9) {
    operator_delete(local_268,CONCAT71(local_258._1_7_,local_258[0]) + 1);
  }
  if (local_290 != __state) {
    operator_delete(local_290,
                    CONCAT71(local_280._M_allocated_capacity._1_7_,local_280._M_local_buf[0]) + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._8_8_ != pbVar8
     ) {
    operator_delete((void *)local_2c8._8_8_,
                    CONCAT71(local_2b0._M_dataplus._M_p._1_7_,local_2b0._M_dataplus._M_p._0_1_) + 1)
    ;
  }
  if ((CMakeInitializeRequest *)local_2f8._16_8_ != pCVar7) {
    operator_delete((void *)local_2f8._16_8_,CONCAT71(uStack_2d7,local_2f8[0x20]) + 1);
  }
  if (local_308 != (cmDebuggerPipeClient_POSIX *)local_2f8) {
    operator_delete(local_308,CONCAT71(local_2f8._1_7_,local_2f8[0]) + 1);
  }
  if (local_578._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_578._M_pi);
  }
LAB_001fba56:
  ScopedThread::~ScopedThread(&local_570);
  if (local_598 != (CMakeInitializeRequest *)0x0) {
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if (local_4c0._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4c0._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_440);
  if (local_4b0._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b0._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise((promise<bool> *)&local_3b0);
  if (local_4a0._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a0._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_428);
  if (local_490._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_398);
  if (local_480._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_480._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_380);
  if (local_470._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_470._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_368);
  if (local_460._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_460._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_410);
  if (p_Stack_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_550);
  }
  if (local_450._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_450._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<void>::~promise(&local_350);
  return bVar10;
}

Assistant:

bool testProtocolWithPipes()
{
  std::promise<void> debuggerConnectionCreatedPromise;
  std::future<void> debuggerConnectionCreatedFuture =
    debuggerConnectionCreatedPromise.get_future();

  std::future<void> startedListeningFuture;

  std::promise<bool> debuggerAdapterInitializedPromise;
  std::future<bool> debuggerAdapterInitializedFuture =
    debuggerAdapterInitializedPromise.get_future();

  std::promise<bool> initializedEventReceivedPromise;
  std::future<bool> initializedEventReceivedFuture =
    initializedEventReceivedPromise.get_future();

  std::promise<bool> exitedEventReceivedPromise;
  std::future<bool> exitedEventReceivedFuture =
    exitedEventReceivedPromise.get_future();

  std::promise<bool> terminatedEventReceivedPromise;
  std::future<bool> terminatedEventReceivedFuture =
    terminatedEventReceivedPromise.get_future();

  std::promise<bool> threadStartedPromise;
  std::future<bool> threadStartedFuture = threadStartedPromise.get_future();

  std::promise<bool> threadExitedPromise;
  std::future<bool> threadExitedFuture = threadExitedPromise.get_future();

  std::promise<bool> disconnectResponseReceivedPromise;
  std::future<bool> disconnectResponseReceivedFuture =
    disconnectResponseReceivedPromise.get_future();

  auto futureTimeout = std::chrono::seconds(60);

#ifdef _WIN32
  std::string namedPipe = R"(\\.\pipe\LOCAL\CMakeDebuggerPipe2_)" +
    cmCryptoHash(cmCryptoHash::AlgoSHA256)
      .HashString(cmSystemTools::GetCurrentWorkingDirectory());
#else
  std::string namedPipe = "CMakeDebuggerPipe2";
#endif

  std::unique_ptr<dap::Session> client = dap::Session::create();
  client->registerHandler([&](const dap::InitializedEvent& e) {
    (void)e;
    initializedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ExitedEvent& e) {
    (void)e;
    exitedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::TerminatedEvent& e) {
    (void)e;
    terminatedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ThreadEvent& e) {
    if (e.reason == "started") {
      threadStartedPromise.set_value(true);
    } else if (e.reason == "exited") {
      threadExitedPromise.set_value(true);
    }
  });

  ScopedThread debuggerThread([&]() -> int {
    try {
      auto connection =
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(namedPipe);
      startedListeningFuture = connection->StartedListening.get_future();
      debuggerConnectionCreatedPromise.set_value();
      std::shared_ptr<cmDebugger::cmDebuggerAdapter> debuggerAdapter =
        std::make_shared<cmDebugger::cmDebuggerAdapter>(
          connection, dap::file(stdout, false));

      debuggerAdapterInitializedPromise.set_value(true);
      debuggerAdapter->ReportExitCode(0);

      // Ensure the disconnectResponse has been received before
      // destructing debuggerAdapter.
      ASSERT_TRUE(disconnectResponseReceivedFuture.wait_for(futureTimeout) ==
                  std::future_status::ready);
      return 0;
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return -1;
    }
  });

  ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  auto client2Debugger =
    std::make_shared<cmDebugger::cmDebuggerPipeClient>(namedPipe);

  client2Debugger->WaitForConnection();
  client->bind(client2Debugger, client2Debugger);

  dap::CMakeInitializeRequest initializeRequest;
  auto response = client->send(initializeRequest);
  auto initializeResponse = response.get();
  ASSERT_TRUE(!initializeResponse.error);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.major ==
              CMake_VERSION_MAJOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor ==
              CMake_VERSION_MINOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch ==
              CMake_VERSION_PATCH);
  ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest);
  ASSERT_TRUE(
    initializeResponse.response.exceptionBreakpointFilters.has_value());
  dap::LaunchRequest launchRequest;
  auto launchResponse = client->send(launchRequest).get();
  ASSERT_TRUE(!launchResponse.error);

  dap::ConfigurationDoneRequest configurationDoneRequest;
  auto configurationDoneResponse =
    client->send(configurationDoneRequest).get();
  ASSERT_TRUE(!configurationDoneResponse.error);

  ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  dap::DisconnectRequest disconnectRequest;
  auto disconnectResponse = client->send(disconnectRequest).get();
  disconnectResponseReceivedPromise.set_value(true);
  ASSERT_TRUE(!disconnectResponse.error);

  return true;
}